

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *local_30;
  MemoryAccountantAllocationNode *node_1;
  MemoryAccountantAllocationNode *node;
  size_t size_local;
  MemoryAccountant *this_local;
  
  if ((this->useCacheSizes_ & 1U) == 0) {
    for (local_30 = this->head_; local_30 != (MemoryAccountantAllocationNode *)0x0;
        local_30 = local_30->next_) {
      if (local_30->size_ == size) {
        return local_30;
      }
    }
  }
  else {
    for (node_1 = this->head_; node_1 != (MemoryAccountantAllocationNode *)0x0;
        node_1 = node_1->next_) {
      if (((node_1->size_ < size) && (node_1->next_ == (MemoryAccountantAllocationNode *)0x0)) ||
         ((size <= node_1->size_ && ((node_1->next_->size_ == 0 || (size < node_1->next_->size_)))))
         ) {
        return node_1;
      }
    }
  }
  return (MemoryAccountantAllocationNode *)0x0;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findNodeOfSize(size_t size) const
{
    if (useCacheSizes_) {
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
            if (((size > node->size_) && (node->next_ == NULLPTR))
                || ((size <= node->size_) &&
                    !((node->next_->size_ != 0) && (node->next_->size_ <= size))))
                return node;
        }
    }
    else
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
            if (node->size_ == size)
                return node;
    return NULLPTR;
}